

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O3

void __thiscall WasmCGen::Loop(WasmCGen *this)

{
  _Elt_pointer pwVar1;
  
  printf("/*%s*/\n","Loop");
  printf("/*%s*/\n","Block");
  pwVar1 = (this->super_w3SourceGen).labels.c.super__Deque_base<w3Label,_std::allocator<w3Label>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pwVar1 == *(_Elt_pointer *)
                 ((long)&(this->super_w3SourceGen).labels.c.
                         super__Deque_base<w3Label,_std::allocator<w3Label>_>._M_impl.
                         super__Deque_impl_data._M_finish + 8)) {
    pwVar1 = (*(_Map_pointer *)
               ((long)&(this->super_w3SourceGen).labels.c.
                       super__Deque_base<w3Label,_std::allocator<w3Label>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18))[-1] + 0x20;
  }
  pwVar1[-1].arity = 0;
  return;
}

Assistant:

CGEN (Loop)
{
    printf ("/*%s*/\n", __func__);
    Block ();
    labels.top ().arity = 0;
}